

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.cc
# Opt level: O0

bool board::evaluate::materialDraw(Board *pos)

{
  int iVar1;
  int iVar2;
  Board *pos_local;
  
  iVar1 = Board::getPieceNum(pos,4);
  if (((((iVar1 == 0) && (iVar1 = Board::getPieceNum(pos,10), iVar1 == 0)) &&
       (iVar1 = Board::getPieceNum(pos,5), iVar1 == 0)) &&
      ((iVar1 = Board::getPieceNum(pos,0xb), iVar1 == 0 &&
       (iVar1 = Board::getPieceNum(pos,1), iVar1 == 0)))) &&
     (iVar1 = Board::getPieceNum(pos,7), iVar1 == 0)) {
    iVar1 = Board::getPieceNum(pos,9);
    if ((iVar1 == 0) && (iVar1 = Board::getPieceNum(pos,3), iVar1 == 0)) {
      iVar1 = Board::getPieceNum(pos,2);
      if ((iVar1 < 3) && (iVar1 = Board::getPieceNum(pos,8), iVar1 < 3)) {
        return true;
      }
    }
    else {
      iVar1 = Board::getPieceNum(pos,2);
      if ((iVar1 == 0) && (iVar1 = Board::getPieceNum(pos,8), iVar1 == 0)) {
        iVar1 = Board::getPieceNum(pos,3);
        iVar2 = Board::getPieceNum(pos,9);
        iVar1 = iVar1 - iVar2;
        if (iVar1 < 1) {
          iVar1 = -iVar1;
        }
        if (iVar1 < 2) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

inline bool board::evaluate::materialDraw(Board& pos)
{
    if (!pos.getPieceNum(WR) && !pos.getPieceNum(BR) && !pos.getPieceNum(WQ) && !pos.getPieceNum(BQ) &&
        !pos.getPieceNum(WP) && !pos.getPieceNum(BP)) {
        if (!pos.getPieceNum(BB) && !pos.getPieceNum(WB)) {
            if (pos.getPieceNum(WN) < 3 && pos.getPieceNum(BN) < 3) {
                return true;
            }
        }
        else if (!pos.getPieceNum(WN) && !pos.getPieceNum(BN)) {
            if (abs(pos.getPieceNum(WB) - pos.getPieceNum(BB)) < 2) {
                return true;
            }
        }
    }
    return false;
}